

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cgtAig.c
# Opt level: O2

void Cgt_ManDetectFanout_rec(Aig_Man_t *pAig,Aig_Obj_t *pObj,int nOdcMax,Vec_Ptr_t *vFanout)

{
  int iVar1;
  Aig_Obj_t *pObj_00;
  uint uVar2;
  
  if ((*(uint *)&pObj->field_0x18 & 7) != 3) {
    iVar1 = Aig_ObjLevel(pObj);
    if ((iVar1 <= nOdcMax) && (pObj->TravId != pAig->nTravIds)) {
      pObj->TravId = pAig->nTravIds;
      Vec_PtrPush(vFanout,pObj);
      if (pAig->pFanData == (int *)0x0) {
        __assert_fail("pAig->pFanData",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/cgt/cgtAig.c"
                      ,100,
                      "void Cgt_ManDetectFanout_rec(Aig_Man_t *, Aig_Obj_t *, int, Vec_Ptr_t *)");
      }
      iVar1 = -1;
      for (uVar2 = 0; uVar2 < *(uint *)&pObj->field_0x18 >> 6; uVar2 = uVar2 + 1) {
        if (uVar2 == 0) {
          iVar1 = Aig_ObjFanout0Int(pAig,pObj->Id);
        }
        else {
          iVar1 = Aig_ObjFanoutNext(pAig,iVar1);
        }
        pObj_00 = Aig_ManObj(pAig,iVar1 >> 1);
        Cgt_ManDetectFanout_rec(pAig,pObj_00,nOdcMax,vFanout);
      }
    }
  }
  return;
}

Assistant:

void Cgt_ManDetectFanout_rec( Aig_Man_t * pAig, Aig_Obj_t * pObj, int nOdcMax, Vec_Ptr_t * vFanout )
{
    Aig_Obj_t * pFanout;
    int f, iFanout = -1;
    if ( Aig_ObjIsCo(pObj) || Aig_ObjLevel(pObj) > nOdcMax )
        return;
    if ( Aig_ObjIsTravIdCurrent(pAig, pObj) )
        return;
    Aig_ObjSetTravIdCurrent(pAig, pObj);
    Vec_PtrPush( vFanout, pObj );
    Aig_ObjForEachFanout( pAig, pObj, pFanout, iFanout, f )
        Cgt_ManDetectFanout_rec( pAig, pFanout, nOdcMax, vFanout );
}